

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

char * match(MatchState *ms,char *s,char *p)

{
  int *piVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  ptrdiff_t *ppVar9;
  long lVar10;
  byte *unaff_R15;
  long lVar11;
  bool bVar12;
  
  piVar1 = &ms->matchdepth;
  iVar4 = *piVar1;
  *piVar1 = *piVar1 + -1;
  if (iVar4 == 0) {
    luaL_error(ms->L,"pattern too complex");
  }
  pbVar6 = (byte *)ms->p_end;
  pbVar7 = (byte *)s;
  if (pbVar6 != (byte *)p) {
    do {
      switch(*p) {
      case '$':
        if ((byte *)p + 1 == pbVar6) {
          pbVar7 = (byte *)0x0;
          if (s == ms->src_end) {
            pbVar7 = (byte *)s;
          }
          goto LAB_0011ed84;
        }
        break;
      case '%':
        bVar2 = ((byte *)p)[1];
        uVar5 = (uint)bVar2;
        if (9 < bVar2 - 0x30) {
          if (uVar5 != 0x66) {
            if (uVar5 != 0x62) break;
            if (pbVar6 + -1 <= (byte *)p + 2) {
              luaL_error(ms->L,"malformed pattern (missing arguments to \'%%b\')");
            }
            bVar2 = ((byte *)p)[2];
            if (*s == bVar2) {
              pbVar6 = (byte *)s + 1;
              if (pbVar6 < ms->src_end) {
                iVar4 = 1;
                do {
                  if (*pbVar6 == ((byte *)p)[3]) {
                    iVar4 = iVar4 + -1;
                    if (iVar4 == 0) {
                      s = (char *)(pbVar6 + 1);
                      goto LAB_0011ecf5;
                    }
                  }
                  else {
                    iVar4 = iVar4 + (uint)(*pbVar6 == bVar2);
                  }
                  pbVar6 = pbVar6 + 1;
                } while (pbVar6 != (byte *)ms->src_end);
              }
            }
            s = (char *)0x0;
LAB_0011ecf5:
            if ((byte *)s == (byte *)0x0) goto LAB_0011edee;
            p = (char *)((byte *)p + 4);
            goto LAB_0011ec69;
          }
          if (((byte *)p)[2] != 0x5b) {
            luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
          }
          p = (char *)((byte *)p + 2);
          pbVar6 = (byte *)classend(ms,p);
          if (s == ms->src_init) {
            uVar5 = 0;
          }
          else {
            uVar5 = (uint)((byte *)s)[-1];
          }
          iVar4 = matchbracketclass(uVar5,p,(char *)(pbVar6 + -1));
          if ((iVar4 == 0) &&
             (iVar4 = matchbracketclass((uint)(byte)*s,p,(char *)(pbVar6 + -1)), iVar4 != 0))
          goto LAB_0011ec34;
          bVar12 = false;
          unaff_R15 = (byte *)0x0;
          goto LAB_0011ec61;
        }
        if (((bVar2 < 0x31) || (uVar5 = uVar5 - 0x31, (int)(uint)ms->level <= (int)uVar5)) ||
           (ms->capture[uVar5].len == -1)) {
          uVar5 = luaL_error(ms->L,"invalid capture index %%%d");
        }
        uVar8 = ms->capture[(int)uVar5].len;
        if ((ulong)((long)ms->src_end - (long)s) < uVar8) {
          s = (char *)0x0;
        }
        else {
          iVar4 = bcmp(ms->capture[(int)uVar5].init,s,uVar8);
          s = (char *)((byte *)s + uVar8);
          if (iVar4 != 0) {
            s = (char *)0x0;
          }
        }
        if ((byte *)s != (byte *)0x0) {
          p = (char *)((byte *)p + 2);
          goto LAB_0011ec69;
        }
LAB_0011edee:
        pbVar7 = (byte *)0x0;
        goto LAB_0011ed84;
      case '(':
        if (((byte *)p)[1] == 0x29) {
          pbVar6 = (byte *)p + 2;
          iVar4 = -2;
        }
        else {
          pbVar6 = (byte *)p + 1;
          iVar4 = -1;
        }
        pbVar7 = (byte *)start_capture(ms,s,(char *)pbVar6,iVar4);
        goto LAB_0011ed84;
      case ')':
        uVar8 = (ulong)ms->level;
        ppVar9 = &ms->capture[(ulong)ms->level - 1].len;
        goto LAB_0011edcd;
      }
      pbVar6 = (byte *)classend(ms,p);
      iVar4 = singlematch(ms,s,p,(char *)pbVar6);
      bVar2 = *pbVar6;
      if (iVar4 == 0) {
        bVar12 = false;
        unaff_R15 = (byte *)0x0;
        if ((bVar2 < 0x40) && ((0x8000240000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pbVar6 = pbVar6 + 1;
LAB_0011ec34:
          p = (char *)pbVar6;
          bVar12 = true;
          unaff_R15 = (byte *)s;
        }
      }
      else {
        if (bVar2 < 0x2d) {
          if (bVar2 != 0x2a) {
            if (bVar2 != 0x2b) {
LAB_0011ec31:
              s = (char *)((byte *)s + 1);
              goto LAB_0011ec34;
            }
            s = (char *)((byte *)s + 1);
          }
          lVar11 = -1;
          lVar3 = 0;
          do {
            lVar10 = lVar3;
            iVar4 = singlematch(ms,(char *)((byte *)s + lVar11 + 1),p,(char *)pbVar6);
            lVar11 = lVar11 + 1;
            lVar3 = lVar10 + 1;
          } while (iVar4 != 0);
          do {
            if (lVar10 < 0) {
              unaff_R15 = (byte *)0x0;
              break;
            }
            unaff_R15 = (byte *)match(ms,(char *)((byte *)s + lVar10),(char *)(pbVar6 + 1));
            lVar10 = lVar10 + -1;
          } while (unaff_R15 == (byte *)0x0);
        }
        else {
          if (bVar2 == 0x3f) {
            unaff_R15 = (byte *)match(ms,(char *)((byte *)s + 1),(char *)(pbVar6 + 1));
            bVar12 = unaff_R15 == (byte *)0x0;
            if (bVar12) {
              p = (char *)(pbVar6 + 1);
              unaff_R15 = (byte *)s;
            }
            goto LAB_0011ec61;
          }
          if (bVar2 != 0x2d) goto LAB_0011ec31;
          do {
            pbVar7 = (byte *)match(ms,s,(char *)(pbVar6 + 1));
            if (pbVar7 == (byte *)0x0) {
              iVar4 = singlematch(ms,s,p,(char *)pbVar6);
              if (iVar4 == 0) {
                unaff_R15 = (byte *)0x0;
                bVar12 = false;
              }
              else {
                s = (char *)((byte *)s + 1);
                bVar12 = true;
              }
            }
            else {
              bVar12 = false;
              unaff_R15 = pbVar7;
            }
          } while (bVar12);
        }
        bVar12 = false;
      }
LAB_0011ec61:
      s = (char *)unaff_R15;
      pbVar7 = (byte *)s;
      if (!bVar12) break;
LAB_0011ec69:
      pbVar6 = (byte *)ms->p_end;
      pbVar7 = (byte *)s;
      unaff_R15 = (byte *)s;
    } while ((byte *)p != pbVar6);
  }
  goto LAB_0011ed84;
  while( true ) {
    uVar8 = uVar8 - 1;
    lVar3 = *ppVar9;
    ppVar9 = ppVar9 + -2;
    if (lVar3 == -1) break;
LAB_0011edcd:
    if ((long)uVar8 < 1) {
      uVar5 = luaL_error(ms->L,"invalid pattern capture");
      uVar8 = (ulong)uVar5;
      break;
    }
  }
  iVar4 = (int)uVar8;
  ms->capture[iVar4].len = (long)s - (long)ms->capture[iVar4].init;
  pbVar7 = (byte *)match(ms,s,(char *)((byte *)p + 1));
  if (pbVar7 == (byte *)0x0) {
    ms->capture[iVar4].len = -1;
  }
LAB_0011ed84:
  ms->matchdepth = ms->matchdepth + 1;
  return (char *)pbVar7;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  if (ms->matchdepth-- == 0)
    luaL_error(ms->L, "pattern too complex");
  init: /* using goto's to optimize tail recursion */
  if (p != ms->p_end) {  /* end of pattern? */
    switch (*p) {
      case '(': {  /* start capture */
        if (*(p + 1) == ')')  /* position capture? */
          s = start_capture(ms, s, p + 2, CAP_POSITION);
        else
          s = start_capture(ms, s, p + 1, CAP_UNFINISHED);
        break;
      }
      case ')': {  /* end capture */
        s = end_capture(ms, s, p + 1);
        break;
      }
      case '$': {
        if ((p + 1) != ms->p_end)  /* is the '$' the last char in pattern? */
          goto dflt;  /* no; go to default */
        s = (s == ms->src_end) ? s : NULL;  /* check end of string */
        break;
      }
      case L_ESC: {  /* escaped sequences not in the format class[*+?-]? */
        switch (*(p + 1)) {
          case 'b': {  /* balanced string? */
            s = matchbalance(ms, s, p + 2);
            if (s != NULL) {
              p += 4; goto init;  /* return match(ms, s, p + 4); */
            }  /* else fail (s == NULL) */
            break;
          }
          case 'f': {  /* frontier? */
            const char *ep; char previous;
            p += 2;
            if (*p != '[')
              luaL_error(ms->L, "missing '[' after '%%f' in pattern");
            ep = classend(ms, p);  /* points to what is next */
            previous = (s == ms->src_init) ? '\0' : *(s - 1);
            if (!matchbracketclass(uchar(previous), p, ep - 1) &&
               matchbracketclass(uchar(*s), p, ep - 1)) {
              p = ep; goto init;  /* return match(ms, s, ep); */
            }
            s = NULL;  /* match failed */
            break;
          }
          case '0': case '1': case '2': case '3':
          case '4': case '5': case '6': case '7':
          case '8': case '9': {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p + 1)));
            if (s != NULL) {
              p += 2; goto init;  /* return match(ms, s, p + 2) */
            }
            break;
          }
          default: goto dflt;
        }
        break;
      }
      default: dflt: {  /* pattern class plus optional suffix */
        const char *ep = classend(ms, p);  /* points to optional suffix */
        /* does not match at least once? */
        if (!singlematch(ms, s, p, ep)) {
          if (*ep == '*' || *ep == '?' || *ep == '-') {  /* accept empty? */
            p = ep + 1; goto init;  /* return match(ms, s, ep + 1); */
          }
          else  /* '+' or no suffix */
            s = NULL;  /* fail */
        }
        else {  /* matched once */
          switch (*ep) {  /* handle optional suffix */
            case '?': {  /* optional */
              const char *res;
              if ((res = match(ms, s + 1, ep + 1)) != NULL)
                s = res;
              else {
                p = ep + 1; goto init;  /* else return match(ms, s, ep + 1); */
              }
              break;
            }
            case '+':  /* 1 or more repetitions */
              s++;  /* 1 match already done */
              /* FALLTHROUGH */
            case '*':  /* 0 or more repetitions */
              s = max_expand(ms, s, p, ep);
              break;
            case '-':  /* 0 or more repetitions (minimum) */
              s = min_expand(ms, s, p, ep);
              break;
            default:  /* no suffix */
              s++; p = ep; goto init;  /* return match(ms, s + 1, ep); */
          }
        }
        break;
      }
    }
  }
  ms->matchdepth++;
  return s;
}